

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmTasEa<(moira::Instr)124,(moira::Mode)3,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar5 = "tas";
  if (str->upper != false) {
    pcVar5 = "TAS";
  }
  cVar4 = *pcVar5;
  while (cVar4 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar5;
  }
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '(';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  cVar4 = ')';
  lVar6 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar4;
    cVar4 = ")+"[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  return;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    *this << (upper ? instrUpper[I] : instrLower[I]);
    return *this;
}